

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzrot::ArchiveOUT(ChNodeFEAxyzrot *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChFrame<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChNodeFEAxyzrot>(marchive);
  ChNodeBase::ArchiveOUT
            ((ChNodeBase *)
             ((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
             (long)(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3]),marchive);
  ChBodyFrame::ArchiveOUT((ChBodyFrame *)&(this->super_ChNodeFEAbase).field_0x18,marchive);
  local_38._value = &this->X0;
  local_38._name = "X0";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFrame<double>>(marchive,&local_38);
  local_38._value = (ChFrame<double> *)&this->Force;
  local_38._name = "Force";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)&local_38);
  local_38._value = (ChFrame<double> *)&this->Torque;
  local_38._name = "Torque";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)&local_38);
  return;
}

Assistant:

void ChNodeFEAxyzrot::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzrot>();
    // serialize parent class
    ChNodeFEAbase::ArchiveOUT(marchive);
    // serialize parent class
    ChBodyFrame::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(X0);
    marchive << CHNVP(Force);
    marchive << CHNVP(Torque);
}